

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void utf8_suite::test_FC_80_80_80_80_7F(void)

{
  char input [9];
  decoder_type decoder;
  undefined4 local_158;
  value local_154;
  value_type local_150 [16];
  basic_decoder<char> local_140;
  
  local_150[0] = '\"';
  local_150[1] = -4;
  local_150[2] = -0x80;
  local_150[3] = -0x80;
  local_150[4] = -0x80;
  local_150[5] = -0x80;
  local_150[6] = '\x7f';
  local_150[7] = '\"';
  local_150[8] = '\0';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<9ul>
            (&local_140,(value_type (*) [9])local_150);
  local_154 = local_140.current.code;
  local_158 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x890,"void utf8_suite::test_FC_80_80_80_80_7F()",&local_154,&local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[7]>
            ("decoder.literal()","\"\\\"\\xFC\\x80\\x80\\x80\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x891,"void utf8_suite::test_FC_80_80_80_80_7F()",&local_140.current.view,
             anon_var_dwarf_6d08);
  return;
}

Assistant:

void test_FC_80_80_80_80_7F()
{
    const char input[] = "\"\xFC\x80\x80\x80\x80\x7F\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\xFC\x80\x80\x80\x80");
}